

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,string *label,
          string *prediction,size_t num_features,bool progress_add,float progress_arg)

{
  bool bVar1;
  _Setw _Var2;
  _Setprecision _Var3;
  streamsize __wide;
  streamsize __prec;
  ostream *poVar4;
  ostream *poVar5;
  void *pvVar6;
  shared_data *this_00;
  string *in_RCX;
  long in_RDX;
  byte in_SIL;
  shared_data *in_RDI;
  string *in_R8;
  ulong in_R9;
  double dVar7;
  bool holding_out;
  fmtflags saved_f;
  streamsize saved_prec;
  streamsize saved_w;
  
  __wide = std::ios_base::width((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  __prec = std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  std::ios_base::flags((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  bVar1 = false;
  if (((in_SIL & 1) == 0) && (in_RDX != 0)) {
    if ((((in_RDI->holdout_sum_loss != 0.0) || (NAN(in_RDI->holdout_sum_loss))) ||
        (in_RDI->weighted_holdout_examples != 0.0)) || (NAN(in_RDI->weighted_holdout_examples))) {
      _Var2 = std::setw(8);
      poVar4 = std::operator<<((ostream *)&std::cerr,_Var2);
      _Var3 = std::setprecision(6);
      poVar4 = std::operator<<(poVar4,_Var3);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,std::fixed);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::right);
      std::ostream::operator<<(pvVar6,in_RDI->holdout_sum_loss / in_RDI->weighted_holdout_examples);
    }
    else {
      _Var2 = std::setw(8);
      poVar4 = std::operator<<((ostream *)&std::cerr,_Var2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
      std::operator<<(poVar4," unknown");
    }
    std::operator<<((ostream *)&std::cerr," ");
    if (((in_RDI->holdout_sum_loss_since_last_dump != 0.0) ||
        (NAN(in_RDI->holdout_sum_loss_since_last_dump))) ||
       ((in_RDI->weighted_holdout_examples_since_last_dump != 0.0 ||
        (NAN(in_RDI->weighted_holdout_examples_since_last_dump))))) {
      _Var2 = std::setw(8);
      poVar4 = std::operator<<((ostream *)&std::cerr,_Var2);
      _Var3 = std::setprecision(6);
      poVar4 = std::operator<<(poVar4,_Var3);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,std::fixed);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::right);
      std::ostream::operator<<
                (pvVar6,in_RDI->holdout_sum_loss_since_last_dump /
                        in_RDI->weighted_holdout_examples_since_last_dump);
    }
    else {
      _Var2 = std::setw(8);
      poVar4 = std::operator<<((ostream *)&std::cerr,_Var2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
      std::operator<<(poVar4," unknown");
    }
    in_RDI->weighted_holdout_examples_since_last_dump = 0.0;
    in_RDI->holdout_sum_loss_since_last_dump = 0.0;
    bVar1 = true;
  }
  else {
    _Var2 = std::setw(8);
    poVar4 = std::operator<<((ostream *)&std::cerr,_Var2);
    _Var3 = std::setprecision(6);
    poVar4 = std::operator<<(poVar4,_Var3);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,std::right);
    std::ostream::operator<<(pvVar6,std::fixed);
    if (in_RDI->weighted_labeled_examples <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"n.a.");
    }
    else {
      std::ostream::operator<<(&std::cerr,in_RDI->sum_loss / in_RDI->weighted_labeled_examples);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr," ");
    _Var2 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var2);
    _Var3 = std::setprecision(6);
    poVar4 = std::operator<<(poVar4,_Var3);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,std::right);
    std::ostream::operator<<(pvVar6,std::fixed);
    if ((in_RDI->weighted_labeled_examples != in_RDI->old_weighted_labeled_examples) ||
       (NAN(in_RDI->weighted_labeled_examples) || NAN(in_RDI->old_weighted_labeled_examples))) {
      std::ostream::operator<<
                (&std::cerr,
                 in_RDI->sum_loss_since_last_dump /
                 (in_RDI->weighted_labeled_examples - in_RDI->old_weighted_labeled_examples));
    }
    else {
      std::operator<<((ostream *)&std::cerr,"n.a.");
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr," ");
  _Var2 = std::setw(0xc);
  poVar5 = std::operator<<(poVar4,_Var2);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::right);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,in_RDI->example_number);
  this_00 = (shared_data *)std::operator<<(poVar5," ");
  _Var2 = std::setw(0xe);
  poVar5 = std::operator<<((ostream *)this_00,_Var2);
  _Var3 = std::setprecision(1);
  poVar5 = std::operator<<(poVar5,_Var3);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::right);
  dVar7 = weighted_examples(in_RDI);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,dVar7);
  poVar5 = std::operator<<(poVar5," ");
  _Var2 = std::setw(8);
  poVar5 = std::operator<<(poVar5,_Var2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
  poVar5 = std::operator<<(poVar5,in_RCX);
  poVar5 = std::operator<<(poVar5," ");
  _Var2 = std::setw(8);
  poVar5 = std::operator<<(poVar5,_Var2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
  poVar5 = std::operator<<(poVar5,in_R8);
  poVar5 = std::operator<<(poVar5," ");
  _Var2 = std::setw(8);
  poVar5 = std::operator<<(poVar5,_Var2);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::right);
  std::ostream::operator<<(pvVar6,in_R9);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr," h");
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  std::ios_base::width((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),__wide);
  std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),__prec);
  std::ios_base::setf((ios_base *)this_00,(fmtflags)((ulong)poVar4 >> 0x20));
  update_dump_interval(this_00,SUB81((ulong)poVar4 >> 0x38,0),SUB84(poVar4,0));
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, const std::string& label, const std::string& prediction,
      size_t num_features, bool progress_add, float progress_arg)
  {
    std::streamsize saved_w = std::cerr.width();
    std::streamsize saved_prec = std::cerr.precision();
    std::ostream::fmtflags saved_f = std::cerr.flags();
    bool holding_out = false;

    if (!holdout_set_off && current_pass >= 1)
    {
      if (holdout_sum_loss == 0. && weighted_holdout_examples == 0.)
        std::cerr << std::setw(col_avg_loss) << std::left << " unknown";
      else
        std::cerr << std::setw(col_avg_loss) << std::setprecision(prec_avg_loss) << std::fixed << std::right
                  << (holdout_sum_loss / weighted_holdout_examples);

      std::cerr << " ";

      if (holdout_sum_loss_since_last_dump == 0. && weighted_holdout_examples_since_last_dump == 0.)
        std::cerr << std::setw(col_since_last) << std::left << " unknown";
      else
        std::cerr << std::setw(col_since_last) << std::setprecision(prec_since_last) << std::fixed << std::right
                  << (holdout_sum_loss_since_last_dump / weighted_holdout_examples_since_last_dump);

      weighted_holdout_examples_since_last_dump = 0;
      holdout_sum_loss_since_last_dump = 0.0;

      holding_out = true;
    }
    else
    {
      std::cerr << std::setw(col_avg_loss) << std::setprecision(prec_avg_loss) << std::right << std::fixed;
      if (weighted_labeled_examples > 0.)
        std::cerr << (sum_loss / weighted_labeled_examples);
      else
        std::cerr << "n.a.";
      std::cerr << " " << std::setw(col_since_last) << std::setprecision(prec_avg_loss) << std::right << std::fixed;
      if (weighted_labeled_examples == old_weighted_labeled_examples)
        std::cerr << "n.a.";
      else
        std::cerr << (sum_loss_since_last_dump / (weighted_labeled_examples - old_weighted_labeled_examples));
    }
    std::cerr << " " << std::setw(col_example_counter) << std::right << example_number << " "
              << std::setw(col_example_weight) << std::setprecision(prec_example_weight) << std::right
              << weighted_examples() << " " << std::setw(col_current_label) << std::right << label << " "
              << std::setw(col_current_predict) << std::right << prediction << " " << std::setw(col_current_features)
              << std::right << num_features;

    if (holding_out)
      std::cerr << " h";

    std::cerr << std::endl;
    std::cerr.flush();

    std::cerr.width(saved_w);
    std::cerr.precision(saved_prec);
    std::cerr.setf(saved_f);

    update_dump_interval(progress_add, progress_arg);
  }